

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_enc.c
# Opt level: O0

int GetHuffBitLengthsAndCodes(VP8LHistogramSet *histogram_image,HuffmanTreeCode *huffman_codes)

{
  int iVar1;
  long lVar2;
  uint32_t *histogram;
  void *pvVar3;
  void *pvVar4;
  uint8_t *buf_rle_00;
  void *in_RSI;
  int *in_RDI;
  VP8LHistogram *histo_1;
  HuffmanTreeCode *codes_2;
  int bit_length;
  uint8_t *lengths;
  uint16_t *codes_1;
  int num_symbols;
  HuffmanTreeCode *codes;
  VP8LHistogram *histo;
  HuffmanTree *huff_tree;
  uint8_t *buf_rle;
  int max_num_symbols;
  int histogram_image_size;
  uint8_t *mem_buf;
  uint64_t total_length_size;
  int ok;
  int k;
  int i;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  uint64_t in_stack_ffffffffffffff78;
  HuffmanTree *huff_tree_00;
  int in_stack_ffffffffffffff8c;
  void *local_68;
  int local_38;
  long local_28;
  int local_1c;
  int local_18;
  int local_14;
  
  local_1c = 0;
  local_28 = 0;
  iVar1 = *in_RDI;
  local_38 = 0;
  for (local_14 = 0; local_14 < iVar1; local_14 = local_14 + 1) {
    lVar2 = *(long *)(*(long *)(in_RDI + 2) + (long)local_14 * 8);
    for (local_18 = 0; local_18 < 5; local_18 = local_18 + 1) {
      if (local_18 == 0) {
        in_stack_ffffffffffffff74 = VP8LHistogramNumCodes(*(int *)(lVar2 + 0xca8));
      }
      else {
        in_stack_ffffffffffffff74 = 0x100;
        if (local_18 == 4) {
          in_stack_ffffffffffffff74 = 0x28;
        }
      }
      *(int *)((long)in_RSI + (long)local_18 * 0x18 + (long)(local_14 * 5) * 0x18) =
           in_stack_ffffffffffffff74;
      local_28 = in_stack_ffffffffffffff74 + local_28;
    }
  }
  local_68 = WebPSafeCalloc(in_stack_ffffffffffffff78,
                            CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  if (local_68 != (void *)0x0) {
    histogram = (uint32_t *)((long)local_68 + local_28 * 2);
    for (local_14 = 0; SBORROW4(local_14,iVar1 * 5) != local_14 + iVar1 * -5 < 0;
        local_14 = local_14 + 1) {
      in_stack_ffffffffffffff8c = *(int *)((long)in_RSI + (long)local_14 * 0x18);
      *(void **)((long)in_RSI + (long)local_14 * 0x18 + 0x10) = local_68;
      *(uint32_t **)((long)in_RSI + (long)local_14 * 0x18 + 8) = histogram;
      local_68 = (void *)((long)local_68 + (long)in_stack_ffffffffffffff8c * 2);
      histogram = (uint32_t *)((long)histogram + (long)in_stack_ffffffffffffff8c);
      if (local_38 < in_stack_ffffffffffffff8c) {
        local_38 = in_stack_ffffffffffffff8c;
      }
    }
    pvVar3 = WebPSafeMalloc(in_stack_ffffffffffffff78,
                            CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    pvVar4 = WebPSafeMalloc(in_stack_ffffffffffffff78,
                            CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    if ((pvVar3 != (void *)0x0) && (pvVar4 != (void *)0x0)) {
      for (local_14 = 0; local_14 < iVar1; local_14 = local_14 + 1) {
        buf_rle_00 = (uint8_t *)((long)in_RSI + (long)(local_14 * 5) * 0x18);
        huff_tree_00 = *(HuffmanTree **)(*(long *)(in_RDI + 2) + (long)local_14 * 8);
        VP8LCreateHuffmanTree
                  (histogram,in_stack_ffffffffffffff8c,buf_rle_00,huff_tree_00,
                   (HuffmanTreeCode *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70))
        ;
        VP8LCreateHuffmanTree
                  (histogram,in_stack_ffffffffffffff8c,buf_rle_00,huff_tree_00,
                   (HuffmanTreeCode *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70))
        ;
        VP8LCreateHuffmanTree
                  (histogram,in_stack_ffffffffffffff8c,buf_rle_00,huff_tree_00,
                   (HuffmanTreeCode *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70))
        ;
        VP8LCreateHuffmanTree
                  (histogram,in_stack_ffffffffffffff8c,buf_rle_00,huff_tree_00,
                   (HuffmanTreeCode *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70))
        ;
        VP8LCreateHuffmanTree
                  (histogram,in_stack_ffffffffffffff8c,buf_rle_00,huff_tree_00,
                   (HuffmanTreeCode *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70))
        ;
      }
      local_1c = 1;
    }
  }
  WebPSafeFree((void *)0x1b2e88);
  WebPSafeFree((void *)0x1b2e92);
  if (local_1c == 0) {
    WebPSafeFree((void *)0x1b2ea3);
    memset(in_RSI,0,(long)(iVar1 * 5) * 0x18);
  }
  return local_1c;
}

Assistant:

static int GetHuffBitLengthsAndCodes(
    const VP8LHistogramSet* const histogram_image,
    HuffmanTreeCode* const huffman_codes) {
  int i, k;
  int ok = 0;
  uint64_t total_length_size = 0;
  uint8_t* mem_buf = NULL;
  const int histogram_image_size = histogram_image->size;
  int max_num_symbols = 0;
  uint8_t* buf_rle = NULL;
  HuffmanTree* huff_tree = NULL;

  // Iterate over all histograms and get the aggregate number of codes used.
  for (i = 0; i < histogram_image_size; ++i) {
    const VP8LHistogram* const histo = histogram_image->histograms[i];
    HuffmanTreeCode* const codes = &huffman_codes[5 * i];
    assert(histo != NULL);
    for (k = 0; k < 5; ++k) {
      const int num_symbols =
          (k == 0) ? VP8LHistogramNumCodes(histo->palette_code_bits) :
          (k == 4) ? NUM_DISTANCE_CODES : 256;
      codes[k].num_symbols = num_symbols;
      total_length_size += num_symbols;
    }
  }

  // Allocate and Set Huffman codes.
  {
    uint16_t* codes;
    uint8_t* lengths;
    mem_buf = (uint8_t*)WebPSafeCalloc(total_length_size,
                                       sizeof(*lengths) + sizeof(*codes));
    if (mem_buf == NULL) goto End;

    codes = (uint16_t*)mem_buf;
    lengths = (uint8_t*)&codes[total_length_size];
    for (i = 0; i < 5 * histogram_image_size; ++i) {
      const int bit_length = huffman_codes[i].num_symbols;
      huffman_codes[i].codes = codes;
      huffman_codes[i].code_lengths = lengths;
      codes += bit_length;
      lengths += bit_length;
      if (max_num_symbols < bit_length) {
        max_num_symbols = bit_length;
      }
    }
  }

  buf_rle = (uint8_t*)WebPSafeMalloc(1ULL, max_num_symbols);
  huff_tree = (HuffmanTree*)WebPSafeMalloc(3ULL * max_num_symbols,
                                           sizeof(*huff_tree));
  if (buf_rle == NULL || huff_tree == NULL) goto End;

  // Create Huffman trees.
  for (i = 0; i < histogram_image_size; ++i) {
    HuffmanTreeCode* const codes = &huffman_codes[5 * i];
    VP8LHistogram* const histo = histogram_image->histograms[i];
    VP8LCreateHuffmanTree(histo->literal, 15, buf_rle, huff_tree, codes + 0);
    VP8LCreateHuffmanTree(histo->red, 15, buf_rle, huff_tree, codes + 1);
    VP8LCreateHuffmanTree(histo->blue, 15, buf_rle, huff_tree, codes + 2);
    VP8LCreateHuffmanTree(histo->alpha, 15, buf_rle, huff_tree, codes + 3);
    VP8LCreateHuffmanTree(histo->distance, 15, buf_rle, huff_tree, codes + 4);
  }
  ok = 1;
 End:
  WebPSafeFree(huff_tree);
  WebPSafeFree(buf_rle);
  if (!ok) {
    WebPSafeFree(mem_buf);
    memset(huffman_codes, 0, 5 * histogram_image_size * sizeof(*huffman_codes));
  }
  return ok;
}